

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

char * kj::skipSpace(char *p)

{
  char *local_10;
  char *p_local;
  
  for (local_10 = p; (*local_10 == '\t' || (*local_10 == ' ')); local_10 = local_10 + 1) {
  }
  return local_10;
}

Assistant:

static inline const char* skipSpace(const char* p) {
  for (;;) {
    switch (*p) {
      case '\t':
      case ' ':
        ++p;
        break;
      default:
        return p;
    }
  }
}